

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,VariableDeclaration *v)

{
  Statement *pSVar1;
  bool bVar2;
  Expression *pEVar3;
  Context *local_a0;
  CompileMessage local_90;
  undefined1 local_48 [8];
  Context context;
  Type type;
  VariableDeclaration *v_local;
  PostResolutionChecks *this_local;
  
  ASTVisitor::visit(&this->super_ASTVisitor,v);
  bVar2 = pool_ptr<soul::AST::Expression>::operator==(&v->declaredType,(void *)0x0);
  if (bVar2) {
    pEVar3 = pool_ptr<soul::AST::Expression>::operator*(&v->initialValue);
    throwErrorIfNotReadableValue(pEVar3);
  }
  else {
    pEVar3 = pool_ptr<soul::AST::Expression>::operator*(&v->declaredType);
    throwErrorIfNotReadableType(pEVar3);
  }
  AST::VariableDeclaration::getType((Type *)&context.parentScope,v);
  bVar2 = pool_ptr<soul::AST::Expression>::operator!=(&v->declaredType,(void *)0x0);
  if (bVar2) {
    pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&v->declaredType);
    pSVar1 = &pEVar3->super_Statement;
  }
  else {
    pSVar1 = &v->super_Statement;
  }
  local_a0 = &(pSVar1->super_ASTObject).context;
  AST::Context::Context((Context *)local_48,local_a0);
  bVar2 = Type::isVoid((Type *)&context.parentScope);
  if (!bVar2) {
    throwErrorIfMultidimensionalArray((Context *)local_48,(Type *)&context.parentScope);
    AST::Context::~Context((Context *)local_48);
    Type::~Type((Type *)&context.parentScope);
    return;
  }
  Errors::variableCannotBeVoid<>();
  AST::Context::throwError((Context *)local_48,&local_90,false);
}

Assistant:

void visit (AST::VariableDeclaration& v) override
        {
            super::visit (v);

            if (v.declaredType == nullptr)
                throwErrorIfNotReadableValue (*v.initialValue);
            else
                throwErrorIfNotReadableType (*v.declaredType);

            auto type = v.getType();
            auto context = (v.declaredType != nullptr ? v.declaredType->context : v.context);

            if (type.isVoid())
                context.throwError (Errors::variableCannotBeVoid());

            throwErrorIfMultidimensionalArray (context, type);
        }